

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O1

void SetModesMenu(int w,int h,int bits)

{
  int i;
  ulong uVar1;
  FOptionMenuDescriptor *this;
  FOptionMenuItem *pFVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int hi_bits;
  char strtemp [64];
  FName local_78;
  FName local_74;
  FName local_70;
  FName local_6c;
  char local_68 [64];
  
  uVar1 = 0;
  do {
    if ((uint)BitTranslate[uVar1] == bits) goto LAB_00317775;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x16);
  uVar1 = 0;
LAB_00317775:
  FBaseCVar::SetGenericRep(&DummyDepthCvar.super_FBaseCVar,(char *)(uVar1 & 0xffffffff),CVAR_Int);
  this = GetVideoModeMenu();
  hi_bits = extraout_EDX;
  if (this != (FOptionMenuDescriptor *)0x0) {
    if (testingmode < 2) {
      local_6c.Index = 0x220;
      pFVar2 = FOptionMenuDescriptor::GetItem(this,&local_6c);
      if (pFVar2 != (FOptionMenuItem *)0x0) {
        (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[10])(pFVar2,0,0);
      }
      local_70.Index = 0x221;
      pFVar2 = FOptionMenuDescriptor::GetItem(this,&local_70);
      hi_bits = extraout_EDX_00;
      if (pFVar2 != (FOptionMenuItem *)0x0) {
        (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[10])(pFVar2,0,0);
        hi_bits = extraout_EDX_01;
      }
    }
    else {
      local_74.Index = 0x221;
      pFVar2 = FOptionMenuDescriptor::GetItem(this,&local_74);
      if (pFVar2 != (FOptionMenuItem *)0x0) {
        (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[10])(pFVar2,0,1);
      }
      local_78.Index = 0x220;
      pFVar2 = FOptionMenuDescriptor::GetItem(this,&local_78);
      hi_bits = extraout_EDX_02;
      if (pFVar2 != (FOptionMenuItem *)0x0) {
        mysnprintf(local_68,0x40,"TESTING %dx%dx%d",w,h,(ulong)(uint)bits);
        (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[10])(pFVar2,0,1);
        (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[8])(pFVar2,0,local_68);
        hi_bits = extraout_EDX_03;
      }
    }
  }
  BuildModesList(w,h,hi_bits);
  return;
}

Assistant:

static void SetModesMenu (int w, int h, int bits)
{
	DummyDepthCvar = FindBits (bits);

	FOptionMenuDescriptor *opt = GetVideoModeMenu();
	if (opt != NULL)
	{
		FOptionMenuItem *it;
		if (testingmode <= 1)
		{
			it = opt->GetItem(NAME_VMEnterText);
			if (it != NULL) it->SetValue(0, 0);
			it = opt->GetItem(NAME_VMTestText);
			if (it != NULL) it->SetValue(0, 0);
		}
		else
		{

			it = opt->GetItem(NAME_VMTestText);
			if (it != NULL) it->SetValue(0, 1);
			it = opt->GetItem(NAME_VMEnterText);
			if (it != NULL) 
			{
				char strtemp[64];
				mysnprintf (strtemp, countof(strtemp), "TESTING %dx%dx%d", w, h, bits);
				it->SetValue(0, 1);
				it->SetString(0, strtemp);
			}
		}
	}
	BuildModesList (w, h, bits);
}